

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O3

bool __thiscall
Fossilize::FeatureFilter::Impl::register_shader_module_info
          (Impl *this,VkShaderModule module,VkShaderModuleCreateInfo *info)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  ModuleInfo module_info;
  ModuleInfo local_58;
  VkShaderModule local_40;
  vector<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
  local_38;
  
  local_58.deferred_entry_points.
  super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.deferred_entry_points.
  super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.deferred_entry_points.
  super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = module;
  bVar1 = parse_module_info(this,info->pCode,info->codeSize,&local_58);
  if ((bVar1) &&
     (local_58.deferred_entry_points.
      super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.deferred_entry_points.
      super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->module_to_info_lock);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    pmVar3 = std::__detail::
             _Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>,_std::allocator<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>,_std::allocator<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->module_to_info,&local_40);
    local_38.
    super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pmVar3->deferred_entry_points).
         super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_38.
    super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pmVar3->deferred_entry_points).
         super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_38.
    super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pmVar3->deferred_entry_points).
         super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pmVar3->deferred_entry_points).
    super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_58.deferred_entry_points.
         super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pmVar3->deferred_entry_points).
    super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_58.deferred_entry_points.
         super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pmVar3->deferred_entry_points).
    super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_58.deferred_entry_points.
         super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.deferred_entry_points.
    super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.deferred_entry_points.
    super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.deferred_entry_points.
    super__Vector_base<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
    ::~vector(&local_38);
    pthread_mutex_unlock((pthread_mutex_t *)&this->module_to_info_lock);
  }
  std::
  vector<Fossilize::FeatureFilter::Impl::DeferredEntryPoint,_std::allocator<Fossilize::FeatureFilter::Impl::DeferredEntryPoint>_>
  ::~vector(&local_58.deferred_entry_points);
  return bVar1;
}

Assistant:

bool FeatureFilter::Impl::register_shader_module_info(VkShaderModule module, const VkShaderModuleCreateInfo *info)
{
	ModuleInfo module_info;
	if (parse_module_info(info->pCode, info->codeSize, module_info))
	{
		if (!module_info.deferred_entry_points.empty())
		{
			std::lock_guard<std::mutex> holder{module_to_info_lock};
			module_to_info[module] = std::move(module_info);
		}
		return true;
	}
	else
		return false;
}